

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerCPP::emit_function_prototype
          (CompilerCPP *this,SPIRFunction *func,Bitset *param_2)

{
  uint uVar1;
  size_t sVar2;
  Variant *pVVar3;
  SPIRType *pSVar4;
  ulong uVar5;
  SPIRVariable *pSVar6;
  long lVar7;
  Parameter *arg;
  Parameter *arg_00;
  string decl;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((func->super_IVariant).self.id !=
      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&(this->super_CompilerGLSL).local_variable_names,
             &(this->super_CompilerGLSL).resource_names._M_h);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(func->super_IVariant).field_0xc);
  ::std::__cxx11::string::append((char *)&local_50);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_70,this,pSVar4,0);
  ::std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)&local_50);
  uVar1 = (func->super_IVariant).self.id;
  if (uVar1 == (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    ::std::__cxx11::string::append((char *)&local_50);
    (this->super_CompilerGLSL).processing_entry_point = true;
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_70,this,(ulong)uVar1,1);
    ::std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  ::std::__cxx11::string::append((char *)&local_50);
  sVar2 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  if (sVar2 != 0) {
    arg_00 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
    lVar7 = sVar2 * 0x14;
    do {
      CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,(arg_00->id).id);
      argument_decl_abi_cxx11_(&local_70,this,arg_00);
      ::std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (arg_00 != (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr +
                    ((func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                     buffer_size - 1)) {
        ::std::__cxx11::string::append((char *)&local_50);
      }
      uVar5 = (ulong)(arg_00->id).id;
      if ((uVar5 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr, pVVar3[uVar5].type == TypeVariable))
      {
        pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar5);
      }
      else {
        pSVar6 = (SPIRVariable *)0x0;
      }
      if (pSVar6 != (SPIRVariable *)0x0) {
        pSVar6->parameter = arg_00;
      }
      arg_00 = arg_00 + 1;
      lVar7 = lVar7 + -0x14;
    } while (lVar7 != 0);
  }
  ::std::__cxx11::string::append((char *)&local_50);
  CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerCPP::emit_function_prototype(SPIRFunction &func, const Bitset &)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	local_variable_names = resource_names;
	string decl;

	auto &type = get<SPIRType>(func.return_type);
	decl += "inline ";
	decl += type_to_glsl(type);
	decl += " ";

	if (func.self == ir.default_entry_point)
	{
		decl += "main";
		processing_entry_point = true;
	}
	else
		decl += to_name(func.self);

	decl += "(";
	for (auto &arg : func.arguments)
	{
		add_local_variable_name(arg.id);

		decl += argument_decl(arg);
		if (&arg != &func.arguments.back())
			decl += ", ";

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	decl += ")";
	statement(decl);
}